

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

string * __thiscall
soul::ResolutionPass::GenericFunctionResolver::getIDStringForFunction_abi_cxx11_
          (string *__return_storage_ptr__,GenericFunctionResolver *this,
          Function *resolvedGenericFunction)

{
  bool bVar1;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *this_00;
  reference ppVar2;
  UsingDeclaration *pUVar3;
  TypeArray *types_00;
  Type local_130;
  pool_ref<soul::AST::UsingDeclaration> local_118;
  pool_ref<soul::AST::UsingDeclaration> t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  *__range2;
  TypeArray types;
  Function *resolvedGenericFunction_local;
  GenericFunctionResolver *this_local;
  
  types.space[0x17] = (uint64_t)resolvedGenericFunction;
  ArrayWithPreallocation<soul::Type,_8UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)&__range2);
  this_00 = (vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             *)(types.space[0x17] + 0x88);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ::begin(this_00);
  t.object = (UsingDeclaration *)
             std::
             vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
             ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
                                *)&t);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
             ::operator*(&__end2);
    local_118.object = ppVar2->object;
    pUVar3 = pool_ref<soul::AST::UsingDeclaration>::operator->(&local_118);
    (*(pUVar3->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.
      _vptr_ASTObject[5])(&local_130);
    ArrayWithPreallocation<soul::Type,_8UL>::push_back
              ((ArrayWithPreallocation<soul::Type,_8UL> *)&__range2,&local_130);
    Type::~Type(&local_130);
    pool_ref<soul::AST::UsingDeclaration>::~pool_ref(&local_118);
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::AST::UsingDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  ASTUtilities::getTypeArraySignature_abi_cxx11_
            (__return_storage_ptr__,(ASTUtilities *)&__range2,types_00);
  ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string getIDStringForFunction (const AST::Function& resolvedGenericFunction)
        {
            AST::TypeArray types;

            for (auto t : resolvedGenericFunction.genericSpecialisations)
                types.push_back (t->resolveAsType());

            return ASTUtilities::getTypeArraySignature (types);
        }